

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::internal_stream_operator_without_lexical_name_lookup::StreamPrinter::
     PrintValue<wasm::Struct,void,std::ostream&>(Struct *value,ostream *os)

{
  Struct SVar1;
  undefined8 in_stack_ffffffffffffffa8;
  pointer this;
  Struct local_30;
  ostream *local_18;
  ostream *os_local;
  Struct *value_local;
  
  this = (pointer)&local_30;
  local_18 = os;
  os_local = (ostream *)value;
  wasm::Struct::Struct((Struct *)this,value);
  SVar1.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)os;
  SVar1.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffffa8;
  SVar1.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = this;
  wasm::operator<<(os,SVar1);
  wasm::Struct::~Struct(&local_30);
  return;
}

Assistant:

static void PrintValue(const T& value, ::std::ostream* os) {
    // Call streaming operator found by ADL, possibly with implicit conversions
    // of the arguments.
    *os << value;
  }